

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

int32_t uscript_getSampleString_63
                  (UScriptCode script,UChar *dest,int32_t capacity,UErrorCode *pErrorCode)

{
  uint length;
  int32_t iVar1;
  UChar UVar2;
  uint uVar3;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((-1 < capacity) && (dest != (UChar *)0x0 || capacity == 0)) {
      length = 0;
      if ((uint)script < 0xb9) {
        uVar3 = *(uint *)((anonymous_namespace)::SCRIPT_PROPS + (ulong)(uint)script * 4) & 0x1fffff;
        if (uVar3 != 0) {
          length = 2 - (uVar3 < 0x10000);
          if (length <= (uint)capacity) {
            UVar2 = (UChar)*(uint *)((anonymous_namespace)::SCRIPT_PROPS + (ulong)(uint)script * 4);
            if (uVar3 < 0x10000) {
              *dest = UVar2;
              length = 1;
            }
            else {
              *dest = (short)(uVar3 >> 10) + L'ퟀ';
              dest[1] = UVar2 & 0x3ffU | 0xdc00;
              length = 2;
            }
          }
        }
      }
      iVar1 = u_terminateUChars_63(dest,capacity,length,pErrorCode);
      return iVar1;
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }